

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O0

uint get_num_images(char *imgdirpath)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  uint local_2c;
  uint num_images;
  dirent *content;
  DIR *dir;
  char *imgdirpath_local;
  
  __dirp = opendir(imgdirpath);
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"Could not open Folder %s\n",imgdirpath);
    imgdirpath_local._4_4_ = 0;
  }
  else {
    local_2c = 0;
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      iVar1 = strcmp(".",pdVar2->d_name);
      if ((iVar1 != 0) && (iVar1 = strcmp("..",pdVar2->d_name), iVar1 != 0)) {
        local_2c = local_2c + 1;
      }
    }
    closedir(__dirp);
    imgdirpath_local._4_4_ = local_2c;
  }
  return imgdirpath_local._4_4_;
}

Assistant:

static unsigned int get_num_images(char *imgdirpath)
{
    DIR *dir;
    struct dirent* content;
    unsigned int num_images = 0;

    /*Reading the input images from given input directory*/

    dir = opendir(imgdirpath);
    if (!dir) {
        fprintf(stderr, "Could not open Folder %s\n", imgdirpath);
        return 0;
    }

    num_images = 0;
    while ((content = readdir(dir)) != NULL) {
        if (strcmp(".", content->d_name) == 0 || strcmp("..", content->d_name) == 0) {
            continue;
        }
        num_images++;
    }
    closedir(dir);
    return num_images;
}